

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_replace_notAllOccurrences_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x13d8f9;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"0x12x3xx",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x13d93a;
  AString_replace(&string,'x','y',1);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar4 = "(string).capacity == (8)";
    pcVar7 = "(string).capacity";
    pcVar3 = (char *)string.capacity;
LAB_0013dc83:
    iVar1 = 0x740;
LAB_0013df0e:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = (char *)0x8;
    ppcVar5 = &local_60;
    goto LAB_0013df16;
  }
  uStack_50 = 0x13d958;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x740);
  if (string.buffer == (char *)0x0) {
    ppcVar6 = &local_58;
    pcVar4 = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (string).buffer != NULL";
    pcVar8 = "(void*) (string).buffer";
    iVar1 = 0x740;
    goto LAB_0013df61;
  }
  uStack_50 = 0x13d975;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x740);
  pcVar8 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar3 = "";
    pcVar8 = "(null)";
LAB_0013dc17:
    local_60 = "0y12x3xx";
    pcStack_70 = "(\"0y12x3xx\")";
    pcVar4 = "(string).buffer == (\"0y12x3xx\")";
    iVar1 = 0x740;
  }
  else {
    uStack_50 = 0x13d992;
    iVar1 = strcmp("0y12x3xx",string.buffer);
    if (iVar1 != 0) {
      pcVar3 = "\"";
      goto LAB_0013dc17;
    }
    uStack_50 = 0x13d9ab;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x740);
    if (string.size != 8) {
      local_60 = "strlen(\"0y12x3xx\")";
      pcVar4 = "(string).size == strlen(\"0y12x3xx\")";
      pcVar7 = "(string).size";
      pcVar3 = (char *)string.size;
      goto LAB_0013dc83;
    }
    uStack_50 = 0x13d9cb;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x740);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar6 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount";
      iVar1 = 0x741;
LAB_0013df61:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar6 + -8) = test_AString_replace_nullptr_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,pcVar4,pcVar3,pcVar7,pcVar8);
    }
    uStack_50 = 0x13d9ec;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x741);
    uStack_50 = 0x13da06;
    AString_replace(&string,'x','y',2);
    if (string.capacity != 8) {
      local_60 = "(8)";
      pcVar4 = "(string).capacity == (8)";
      pcVar7 = "(string).capacity";
      pcVar3 = (char *)string.capacity;
LAB_0013ddc0:
      iVar1 = 0x743;
      goto LAB_0013df0e;
    }
    uStack_50 = 0x13da25;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x743);
    if (string.buffer == (char *)0x0) {
      ppcVar6 = &local_58;
      pcVar4 = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (string).buffer != NULL";
      pcVar8 = "(void*) (string).buffer";
      iVar1 = 0x743;
      goto LAB_0013df61;
    }
    uStack_50 = 0x13da42;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x743);
    pcVar8 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar3 = "";
      pcVar8 = "(null)";
LAB_0013dd54:
      local_60 = "0y12y3yx";
      pcStack_70 = "(\"0y12y3yx\")";
      pcVar4 = "(string).buffer == (\"0y12y3yx\")";
      iVar1 = 0x743;
    }
    else {
      uStack_50 = 0x13da5f;
      iVar1 = strcmp("0y12y3yx",string.buffer);
      if (iVar1 != 0) {
        pcVar3 = "\"";
        goto LAB_0013dd54;
      }
      uStack_50 = 0x13da78;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x743);
      if (string.size != 8) {
        local_60 = "strlen(\"0y12y3yx\")";
        pcVar4 = "(string).size == strlen(\"0y12y3yx\")";
        pcVar7 = "(string).size";
        pcVar3 = (char *)string.size;
        goto LAB_0013ddc0;
      }
      uStack_50 = 0x13da98;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x743);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        ppcVar6 = &local_68;
        local_60 = "(0)";
        local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
        pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
        pcVar8 = "private_ACUtilsTest_AString_reallocCount";
        iVar1 = 0x744;
        goto LAB_0013df61;
      }
      uStack_50 = 0x13dab9;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x744);
      uStack_50 = 0x13dad3;
      AString_replace(&string,'x','y',3);
      if (string.capacity != 8) {
        local_60 = "(8)";
        pcVar4 = "(string).capacity == (8)";
        pcVar7 = "(string).capacity";
        pcVar3 = (char *)string.capacity;
LAB_0013df09:
        iVar1 = 0x746;
        goto LAB_0013df0e;
      }
      uStack_50 = 0x13daf2;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x746);
      if (string.buffer == (char *)0x0) {
        ppcVar6 = &local_58;
        pcVar4 = "Assertion \'_ck_x != NULL\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) (string).buffer != NULL";
        pcVar8 = "(void*) (string).buffer";
        iVar1 = 0x746;
        goto LAB_0013df61;
      }
      uStack_50 = 0x13db0f;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x746);
      pcVar8 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pcVar8 = "(null)";
        pcVar3 = "";
      }
      else {
        uStack_50 = 0x13db2c;
        iVar1 = strcmp("0y12y3yy",string.buffer);
        if (iVar1 == 0) {
          uStack_50 = 0x13db45;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x746);
          if (string.size == 8) {
            uStack_50 = 0x13db65;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x746);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              uStack_50 = 0x13db86;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x747);
              uStack_50 = 0x13db8f;
              (*string.deallocator)(string.buffer);
              return;
            }
            ppcVar6 = &local_68;
            local_60 = "(0)";
            local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar8 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0x747;
            goto LAB_0013df61;
          }
          local_60 = "strlen(\"0y12y3yy\")";
          pcVar4 = "(string).size == strlen(\"0y12y3yy\")";
          pcVar7 = "(string).size";
          pcVar3 = (char *)string.size;
          goto LAB_0013df09;
        }
        pcVar3 = "\"";
      }
      local_60 = "0y12y3yy";
      pcStack_70 = "(\"0y12y3yy\")";
      pcVar4 = "(string).buffer == (\"0y12y3yy\")";
      iVar1 = 0x746;
    }
  }
  pcVar7 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar5 = &pcStack_80;
  pcStack_80 = pcVar8;
  pcStack_78 = pcVar3;
LAB_0013df16:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x13df1d;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar2,pcVar4,pcVar7);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}